

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void musig_nonce_bitflip(uchar **args,size_t n_flip,size_t n_bytes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  secp256k1_musig_keyagg_cache *keyagg_cache;
  uchar *seckey32;
  secp256k1_pubkey *pubkey;
  secp256k1_scalar *k;
  secp256k1_musig_session *partial_sig;
  secp256k1_musig_pubnonce *psVar4;
  secp256k1_musig_session *session;
  secp256k1_xonly_pubkey *pubkey_00;
  secp256k1_context *secnonce;
  secp256k1_musig_partial_sig *psVar5;
  secp256k1_musig_session *secnonce_00;
  long lVar6;
  uchar *b32;
  secp256k1_musig_session *keypair;
  secp256k1_scalar k2 [2];
  secp256k1_scalar k1 [2];
  secp256k1_scalar sStackY_758;
  secp256k1_scalar sStackY_738;
  secp256k1_ge sStackY_710;
  secp256k1_musig_session *psStackY_6a8;
  secp256k1_musig_keyagg_cache *psStackY_6a0;
  secp256k1_musig_session *psStackY_698;
  secp256k1_musig_partial_sig *apsStack_660 [2];
  secp256k1_musig_pubnonce *apsStack_650 [2];
  uchar auStack_640 [32];
  undefined1 auStack_620 [80];
  uchar auStack_5d0 [32];
  uchar auStack_5b0 [43];
  secp256k1_musig_session sStack_585;
  secp256k1_pubkey sStack_500;
  undefined1 auStack_4c0 [128];
  undefined1 auStack_440 [96];
  undefined1 auStack_3e0 [96];
  undefined1 auStack_380 [268];
  undefined1 auStack_274 [264];
  secp256k1_musig_pubnonce sStack_16c;
  secp256k1_scalar *psStack_e8;
  uchar **ppuStack_e0;
  undefined1 local_a8 [40];
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  secp256k1_scalar local_68;
  secp256k1_scalar local_48;
  
  k = &local_68;
  secp256k1_nonce_function_musig(k,*args,args[1],args[2],args[3],args[4],args[5]);
  testrand_flip(args[n_flip],n_bytes);
  partial_sig = (secp256k1_musig_session *)*args;
  keyagg_cache = (secp256k1_musig_keyagg_cache *)args[2];
  pubkey_00 = (secp256k1_xonly_pubkey *)local_a8;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)pubkey_00,(uchar *)partial_sig,args[1],(uchar *)keyagg_cache,
             args[3],args[4],args[5]);
  secp256k1_scalar_verify(k);
  secp256k1_scalar_verify((secp256k1_scalar *)pubkey_00);
  if ((((local_68.d[0] == local_a8._0_8_) && (local_68.d[1] == local_a8._8_8_)) &&
      (local_68.d[2] == local_a8._16_8_)) && (local_68.d[3] == local_a8._24_8_)) {
    musig_nonce_bitflip_cold_1();
  }
  else {
    k = &local_48;
    pubkey_00 = (secp256k1_xonly_pubkey *)(local_a8 + 0x20);
    secp256k1_scalar_verify(k);
    secp256k1_scalar_verify((secp256k1_scalar *)pubkey_00);
    if (((local_48.d[0] != local_a8._32_8_) || (local_48.d[1] != local_80)) ||
       ((local_48.d[2] != local_78 || (local_48.d[3] != local_70)))) {
      return;
    }
  }
  musig_nonce_bitflip_cold_2();
  b32 = auStack_5d0;
  psVar5 = (secp256k1_musig_partial_sig *)auStack_620;
  psVar4 = (secp256k1_musig_pubnonce *)auStack_274;
  lVar6 = 0;
  psStack_e8 = k;
  ppuStack_e0 = args;
  do {
    psVar4 = psVar4 + 1;
    apsStack_650[lVar6] = psVar4;
    apsStack_660[lVar6] = psVar5;
    psStackY_698 = (secp256k1_musig_session *)0x1610a7;
    testrand256(b32);
    lVar6 = lVar6 + 1;
    b32 = b32 + 0x20;
    psVar5 = psVar5 + 1;
  } while (lVar6 == 1);
  keypair = (secp256k1_musig_session *)auStack_380;
  psStackY_698 = (secp256k1_musig_session *)0x1610d9;
  uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,partial_sig->data);
  psStackY_698 = (secp256k1_musig_session *)0x1610f2;
  uVar2 = secp256k1_keypair_pub(CTX,&sStack_500,(secp256k1_keypair *)keypair);
  secnonce = (secp256k1_context *)auStack_440;
  psStackY_698 = (secp256k1_musig_session *)0x16110a;
  session = keypair;
  memcpy(secnonce,keypair,0x60);
  if ((uVar2 & uVar1) == 0) {
    psStackY_698 = (secp256k1_musig_session *)0x161398;
    musig_tweak_test_helper_cold_12();
LAB_00161398:
    psStackY_698 = (secp256k1_musig_session *)0x16139d;
    musig_tweak_test_helper_cold_11();
LAB_0016139d:
    psStackY_698 = (secp256k1_musig_session *)0x1613a2;
    musig_tweak_test_helper_cold_1();
LAB_001613a2:
    psStackY_698 = (secp256k1_musig_session *)0x1613a7;
    musig_tweak_test_helper_cold_2();
LAB_001613a7:
    psStackY_698 = (secp256k1_musig_session *)0x1613ac;
    musig_tweak_test_helper_cold_10();
LAB_001613ac:
    psStackY_698 = (secp256k1_musig_session *)0x1613b1;
    musig_tweak_test_helper_cold_9();
LAB_001613b1:
    psStackY_698 = (secp256k1_musig_session *)0x1613b6;
    musig_tweak_test_helper_cold_8();
LAB_001613b6:
    psStackY_698 = (secp256k1_musig_session *)0x1613bb;
    musig_tweak_test_helper_cold_7();
LAB_001613bb:
    psStackY_698 = (secp256k1_musig_session *)0x1613c0;
    musig_tweak_test_helper_cold_3();
LAB_001613c0:
    psStackY_698 = (secp256k1_musig_session *)0x1613c5;
    musig_tweak_test_helper_cold_4();
  }
  else {
    secnonce = (secp256k1_context *)auStack_3e0;
    session = (secp256k1_musig_session *)auStack_380;
    psStackY_698 = (secp256k1_musig_session *)0x16113f;
    uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session,seckey32);
    psStackY_698 = (secp256k1_musig_session *)0x161153;
    uVar2 = secp256k1_keypair_pub(CTX,(secp256k1_pubkey *)auStack_4c0,(secp256k1_keypair *)session);
    keypair = (secp256k1_musig_session *)(ulong)uVar2;
    psStackY_698 = (secp256k1_musig_session *)0x161166;
    memcpy(secnonce,session,0x60);
    if ((uVar2 & uVar1) == 0) goto LAB_00161398;
    psStackY_698 = (secp256k1_musig_session *)0x161179;
    testrand256(auStack_640);
    session = (secp256k1_musig_session *)auStack_380;
    psStackY_698 = (secp256k1_musig_session *)0x1611be;
    secnonce = CTX;
    iVar3 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)session,
                       (secp256k1_musig_pubnonce *)(auStack_274 + 0x84),auStack_5d0,
                       partial_sig->data,&sStack_500,(uchar *)0x0,
                       (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar3 != 1) goto LAB_0016139d;
    secnonce_00 = (secp256k1_musig_session *)(auStack_380 + 0x84);
    keypair = (secp256k1_musig_session *)auStack_4c0;
    psStackY_698 = (secp256k1_musig_session *)0x16120c;
    session = secnonce_00;
    secnonce = CTX;
    iVar3 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)secnonce_00,&sStack_16c,auStack_5b0,seckey32,
                       (secp256k1_pubkey *)keypair,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,
                       (uchar *)0x0);
    if (iVar3 != 1) goto LAB_001613a2;
    session = (secp256k1_musig_session *)auStack_274;
    psStackY_698 = (secp256k1_musig_session *)0x161233;
    secnonce = CTX;
    iVar3 = secp256k1_musig_nonce_agg(CTX,(secp256k1_musig_aggnonce *)session,apsStack_650,2);
    if (iVar3 == 0) goto LAB_001613a7;
    session = &sStack_585;
    psStackY_698 = (secp256k1_musig_session *)0x16125f;
    secnonce = CTX;
    iVar3 = secp256k1_musig_nonce_process
                      (CTX,session,(secp256k1_musig_aggnonce *)auStack_274,auStack_640,keyagg_cache)
    ;
    if (iVar3 == 0) goto LAB_001613ac;
    session = (secp256k1_musig_session *)auStack_620;
    psStackY_698 = (secp256k1_musig_session *)0x161293;
    secnonce = CTX;
    iVar3 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)session,
                       (secp256k1_musig_secnonce *)auStack_380,(secp256k1_keypair *)auStack_440,
                       keyagg_cache,&sStack_585);
    if (iVar3 == 0) goto LAB_001613b1;
    partial_sig = (secp256k1_musig_session *)(auStack_620 + 0x24);
    psStackY_698 = (secp256k1_musig_session *)0x1612c8;
    session = partial_sig;
    secnonce = CTX;
    iVar3 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig,
                       (secp256k1_musig_secnonce *)secnonce_00,(secp256k1_keypair *)auStack_3e0,
                       keyagg_cache,&sStack_585);
    if (iVar3 == 0) goto LAB_001613b6;
    session = (secp256k1_musig_session *)auStack_620;
    psStackY_698 = (secp256k1_musig_session *)0x1612fc;
    secnonce = CTX;
    iVar3 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)session,
                       (secp256k1_musig_pubnonce *)(auStack_274 + 0x84),&sStack_500,keyagg_cache,
                       &sStack_585);
    if (iVar3 != 1) goto LAB_001613bb;
    psStackY_698 = (secp256k1_musig_session *)0x161325;
    session = partial_sig;
    secnonce = CTX;
    iVar3 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig,&sStack_16c,
                       (secp256k1_pubkey *)keypair,keyagg_cache,&sStack_585);
    if (iVar3 != 1) goto LAB_001613c0;
    session = (secp256k1_musig_session *)(auStack_4c0 + 0x40);
    psStackY_698 = (secp256k1_musig_session *)0x161355;
    secnonce = CTX;
    iVar3 = secp256k1_musig_partial_sig_agg(CTX,(uchar *)session,&sStack_585,apsStack_660,2);
    if (iVar3 == 1) {
      session = (secp256k1_musig_session *)(auStack_4c0 + 0x40);
      psStackY_698 = (secp256k1_musig_session *)0x16137d;
      secnonce = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)session,auStack_640,0x20,pubkey_00);
      if (iVar3 != 0) {
        return;
      }
      goto LAB_001613ca;
    }
  }
  psStackY_698 = (secp256k1_musig_session *)0x1613ca;
  musig_tweak_test_helper_cold_5();
LAB_001613ca:
  psStackY_698 = (secp256k1_musig_session *)musig_test_set_secnonce;
  musig_tweak_test_helper_cold_6();
  psStackY_6a8 = partial_sig;
  psStackY_6a0 = keyagg_cache;
  psStackY_698 = keypair;
  secp256k1_scalar_set_b32(&sStackY_758,session->data,(int *)0x0);
  secp256k1_scalar_set_b32(&sStackY_738,session->data + 0x20,(int *)0x0);
  iVar3 = secp256k1_pubkey_load(CTX,&sStackY_710,pubkey);
  if (iVar3 != 0) {
    secp256k1_musig_secnonce_save((secp256k1_musig_secnonce *)secnonce,&sStackY_758,&sStackY_710);
    return;
  }
  musig_test_set_secnonce_cold_1();
  return;
}

Assistant:

static void musig_nonce_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes) {
    secp256k1_scalar k1[2], k2[2];

    secp256k1_nonce_function_musig(k1, args[0], args[1], args[2], args[3], args[4], args[5]);
    testrand_flip(args[n_flip], n_bytes);
    secp256k1_nonce_function_musig(k2, args[0], args[1], args[2], args[3], args[4], args[5]);
    CHECK(secp256k1_scalar_eq(&k1[0], &k2[0]) == 0);
    CHECK(secp256k1_scalar_eq(&k1[1], &k2[1]) == 0);
}